

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ares_process.c
# Opt level: O0

ares_status_t
ares_requeue_query(ares_query_t *query,ares_timeval_t *now,ares_status_t status,
                  ares_bool_t inc_try_count,ares_dns_record_t *dnsrec,ares_array_t **requeue)

{
  ares_channel_t *channel_00;
  size_t sVar1;
  size_t sVar2;
  size_t max_tries;
  ares_channel_t *channel;
  ares_array_t **requeue_local;
  ares_dns_record_t *dnsrec_local;
  ares_bool_t inc_try_count_local;
  ares_status_t status_local;
  ares_timeval_t *now_local;
  ares_query_t *query_local;
  
  channel_00 = query->channel;
  sVar2 = ares_slist_len(channel_00->servers);
  sVar1 = channel_00->tries;
  ares_query_remove_from_conn(query);
  if (status != ARES_SUCCESS) {
    query->error_status = status;
  }
  if (inc_try_count != ARES_FALSE) {
    query->try_count = query->try_count + 1;
  }
  if ((query->try_count < sVar2 * sVar1) && (query->no_retries == ARES_FALSE)) {
    if (requeue == (ares_array_t **)0x0) {
      query_local._4_4_ = ares_send_query((ares_server_t *)0x0,query,now);
    }
    else {
      query_local._4_4_ = ares_append_requeue(requeue,query,(ares_server_t *)0x0);
    }
  }
  else {
    if (query->error_status == ARES_SUCCESS) {
      query->error_status = ARES_ETIMEOUT;
    }
    end_query(channel_00,(ares_server_t *)0x0,query,query->error_status,dnsrec);
    query_local._4_4_ = ARES_ETIMEOUT;
  }
  return query_local._4_4_;
}

Assistant:

ares_status_t ares_requeue_query(ares_query_t *query, const ares_timeval_t *now,
                                 ares_status_t            status,
                                 ares_bool_t              inc_try_count,
                                 const ares_dns_record_t *dnsrec,
                                 ares_array_t           **requeue)
{
  ares_channel_t *channel   = query->channel;
  size_t          max_tries = ares_slist_len(channel->servers) * channel->tries;

  ares_query_remove_from_conn(query);

  if (status != ARES_SUCCESS) {
    query->error_status = status;
  }

  if (inc_try_count) {
    query->try_count++;
  }

  if (query->try_count < max_tries && !query->no_retries) {
    if (requeue != NULL) {
      return ares_append_requeue(requeue, query, NULL);
    }
    return ares_send_query(NULL, query, now);
  }

  /* If we are here, all attempts to perform query failed. */
  if (query->error_status == ARES_SUCCESS) {
    query->error_status = ARES_ETIMEOUT;
  }

  end_query(channel, NULL, query, query->error_status, dnsrec);
  return ARES_ETIMEOUT;
}